

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

int tga_writeheader(FILE *fp,int bits_per_pixel,int width,int height,OPJ_BOOL flip_image)

{
  size_t sVar1;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined2 local_2e;
  undefined2 local_2c;
  uchar image_desc;
  uchar pixel_depth;
  uchar image_type;
  uchar uc0;
  OPJ_UINT16 us0;
  OPJ_UINT16 image_h;
  OPJ_UINT16 image_w;
  OPJ_BOOL flip_image_local;
  int height_local;
  int width_local;
  int bits_per_pixel_local;
  FILE *fp_local;
  
  if (((bits_per_pixel != 0) && (width != 0)) && (height != 0)) {
    local_31 = 0;
    _image_type = flip_image;
    _image_h = height;
    flip_image_local = width;
    height_local = bits_per_pixel;
    _width_local = (FILE *)fp;
    if (bits_per_pixel < 0x100) {
      local_31 = (undefined1)bits_per_pixel;
      local_2f = 0;
      sVar1 = fwrite(&local_2f,1,1,(FILE *)fp);
      if ((sVar1 == 1) && (sVar1 = fwrite(&local_2f,1,1,_width_local), sVar1 == 1)) {
        local_30 = 2;
        sVar1 = fwrite(&local_30,1,1,_width_local);
        if (sVar1 == 1) {
          local_2e = 0;
          sVar1 = fwrite(&local_2e,2,1,_width_local);
          if (((sVar1 == 1) && (sVar1 = fwrite(&local_2e,2,1,_width_local), sVar1 == 1)) &&
             ((sVar1 = fwrite(&local_2f,1,1,_width_local), sVar1 == 1 &&
              ((sVar1 = fwrite(&local_2e,2,1,_width_local), sVar1 == 1 &&
               (sVar1 = fwrite(&local_2e,2,1,_width_local), sVar1 == 1)))))) {
            _image_desc = (undefined2)flip_image_local;
            local_2c = (undefined2)_image_h;
            sVar1 = fwrite(&image_desc,2,1,_width_local);
            if ((sVar1 == 1) &&
               ((sVar1 = fwrite(&local_2c,2,1,_width_local), sVar1 == 1 &&
                (sVar1 = fwrite(&local_31,1,1,_width_local), sVar1 == 1)))) {
              local_32 = 8;
              if (_image_type != 0) {
                local_32 = 0x28;
              }
              sVar1 = fwrite(&local_32,1,1,_width_local);
              if (sVar1 == 1) {
                return 1;
              }
            }
          }
        }
      }
      fputs("\nwrite_tgaheader: write ERROR\n",_stderr);
    }
    else {
      fprintf(_stderr,"ERROR: Wrong bits per pixel inside tga_header");
    }
  }
  return 0;
}

Assistant:

static int tga_writeheader(FILE *fp, int bits_per_pixel, int width, int height, 
                           OPJ_BOOL flip_image)
{
    OPJ_UINT16 image_w, image_h, us0;
    unsigned char uc0, image_type;
    unsigned char pixel_depth, image_desc;

    if (!bits_per_pixel || !width || !height)
        return 0;

    pixel_depth = 0;

    if ( bits_per_pixel < 256 )
        pixel_depth = (unsigned char)bits_per_pixel;
    else{
        fprintf(stderr,"ERROR: Wrong bits per pixel inside tga_header");
        return 0;
    }
    uc0 = 0;

    if(fwrite(&uc0, 1, 1, fp) != 1) goto fails; /* id_length */
    if(fwrite(&uc0, 1, 1, fp) != 1) goto fails; /* colour_map_type */

    image_type = 2; /* Uncompressed. */
    if(fwrite(&image_type, 1, 1, fp) != 1) goto fails;

    us0 = 0;
    if(fwrite(&us0, 2, 1, fp) != 1) goto fails; /* colour_map_index */
    if(fwrite(&us0, 2, 1, fp) != 1) goto fails; /* colour_map_length */
    if(fwrite(&uc0, 1, 1, fp) != 1) goto fails; /* colour_map_entry_size */

    if(fwrite(&us0, 2, 1, fp) != 1) goto fails; /* x_origin */
    if(fwrite(&us0, 2, 1, fp) != 1) goto fails; /* y_origin */

    image_w = (unsigned short)width;
    image_h = (unsigned short) height;

#ifndef OPJ_BIG_ENDIAN
    if(fwrite(&image_w, 2, 1, fp) != 1) goto fails;
    if(fwrite(&image_h, 2, 1, fp) != 1) goto fails;
#else
    image_w = swap16(image_w);
    image_h = swap16(image_h);
    if(fwrite(&image_w, 2, 1, fp) != 1) goto fails;
    if(fwrite(&image_h, 2, 1, fp) != 1) goto fails;
#endif

    if(fwrite(&pixel_depth, 1, 1, fp) != 1) goto fails;

    image_desc = 8; /* 8 bits per component. */

    if (flip_image)
        image_desc |= 32;
    if(fwrite(&image_desc, 1, 1, fp) != 1) goto fails;

    return 1;

fails:
    fputs("\nwrite_tgaheader: write ERROR\n", stderr);
    return 0;
}